

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::solvePhase1(HEkkDual *this)

{
  double dVar1;
  HEkk *pHVar2;
  HEkk *pHVar3;
  bool bVar4;
  byte bVar5;
  HighsDebugStatus HVar6;
  HighsModelStatus *pHVar7;
  EVP_PKEY_CTX *ctx;
  HEkkDual *in_RDI;
  bool in_stack_00000027;
  HighsInt in_stack_00000028;
  SimplexAlgorithm in_stack_0000002c;
  HEkk *in_stack_00000030;
  bool solve_phase_ok;
  bool no_debug;
  bool finished;
  HighsModelStatus *model_status;
  HighsSimplexStatus *status;
  HighsSimplexInfo *info;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  HEkk *in_stack_ffffffffffffff58;
  allocator *paVar8;
  undefined4 in_stack_ffffffffffffff60;
  undefined2 in_stack_ffffffffffffff64;
  undefined1 in_stack_ffffffffffffff66;
  byte in_stack_ffffffffffffff67;
  int iVar9;
  HEkk *in_stack_ffffffffffffff70;
  allocator local_79;
  string local_78 [7];
  undefined1 in_stack_ffffffffffffff8f;
  HEkk *in_stack_ffffffffffffff90;
  HEkkDual *in_stack_ffffffffffffff98;
  HEkk *in_stack_ffffffffffffffb0;
  allocator local_41;
  HEkkDual *in_stack_ffffffffffffffc0;
  
  pHVar2 = in_RDI->ekk_instance_;
  pHVar3 = in_RDI->ekk_instance_;
  pHVar7 = &in_RDI->ekk_instance_->model_status_;
  (pHVar3->status_).has_primal_objective_value = false;
  (pHVar3->status_).has_dual_objective_value = false;
  in_RDI->rebuild_reason = 0;
  bVar4 = HEkk::bailout(in_stack_ffffffffffffffb0);
  if (!bVar4) {
    highsLogDev(&(in_RDI->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kDetailed,
                "dual-phase-1-start\n");
    HEkk::initialiseBound(in_stack_00000030,in_stack_0000002c,in_stack_00000028,in_stack_00000027);
    HEkk::initialiseNonbasicValueAndMove(in_stack_ffffffffffffff90);
    if (((pHVar2->info_).valid_backtracking_basis_ & 1U) == 0) {
      HEkk::putBacktrackingBasis(in_stack_ffffffffffffff70);
    }
    HighsSimplexAnalysis::simplexTimerStart
              ((HighsSimplexAnalysis *)
               CONCAT17(in_stack_ffffffffffffff67,
                        CONCAT16(in_stack_ffffffffffffff66,
                                 CONCAT24(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))),
               (HighsInt)((ulong)in_stack_ffffffffffffff58 >> 0x20),
               (HighsInt)in_stack_ffffffffffffff58);
    do {
      HighsSimplexAnalysis::simplexTimerStart
                ((HighsSimplexAnalysis *)
                 CONCAT17(in_stack_ffffffffffffff67,
                          CONCAT16(in_stack_ffffffffffffff66,
                                   CONCAT24(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))),
                 (HighsInt)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                 (HighsInt)in_stack_ffffffffffffff58);
      rebuild(in_stack_ffffffffffffffc0);
      HighsSimplexAnalysis::simplexTimerStop
                ((HighsSimplexAnalysis *)
                 CONCAT17(in_stack_ffffffffffffff67,
                          CONCAT16(in_stack_ffffffffffffff66,
                                   CONCAT24(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))),
                 (HighsInt)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                 (HighsInt)in_stack_ffffffffffffff58);
      if (in_RDI->solve_phase == -3) {
        *pHVar7 = kSolveError;
        return;
      }
      if (in_RDI->solve_phase == -1) {
        HighsSimplexAnalysis::simplexTimerStop
                  ((HighsSimplexAnalysis *)
                   CONCAT17(in_stack_ffffffffffffff67,
                            CONCAT16(in_stack_ffffffffffffff66,
                                     CONCAT24(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)))
                   ,(HighsInt)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                   (HighsInt)in_stack_ffffffffffffff58);
        return;
      }
      bVar4 = HEkk::bailout(in_stack_ffffffffffffffb0);
      if (bVar4) break;
      do {
        paVar8 = &local_41;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,"Before iteration",paVar8);
        HVar6 = debugDualSimplex(in_stack_ffffffffffffff98,(string *)in_stack_ffffffffffffff90,
                                 (bool)in_stack_ffffffffffffff8f);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
        std::allocator<char>::~allocator((allocator<char> *)&local_41);
        if (HVar6 == kLogicalError) {
          in_RDI->solve_phase = -3;
          return;
        }
        iVar9 = (pHVar2->info_).simplex_strategy;
        if (iVar9 == 1) {
LAB_00785c2e:
          iterate((HEkkDual *)
                  CONCAT17(in_stack_ffffffffffffff67,
                           CONCAT16(in_stack_ffffffffffffff66,
                                    CONCAT24(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))))
          ;
        }
        else if (iVar9 == 2) {
          iterateTasks((HEkkDual *)
                       CONCAT17(in_stack_ffffffffffffff67,
                                CONCAT16(in_stack_ffffffffffffff66,
                                         CONCAT24(in_stack_ffffffffffffff64,
                                                  in_stack_ffffffffffffff60))));
        }
        else {
          if (iVar9 != 3) goto LAB_00785c2e;
          iterateMulti((HEkkDual *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        }
        bVar4 = HEkk::bailout(in_stack_ffffffffffffffb0);
      } while ((!bVar4) && (in_RDI->rebuild_reason == 0));
      if ((in_RDI->ekk_instance_->solve_bailout_ & 1U) != 0) break;
      in_stack_ffffffffffffff67 = 0;
      if (((pHVar3->status_).has_fresh_rebuild & 1U) != 0) {
        bVar4 = HEkk::rebuildRefactor
                          ((HEkk *)CONCAT44(HVar6,iVar9),
                           (uint)CONCAT12(in_stack_ffffffffffffff66,in_stack_ffffffffffffff64));
        in_stack_ffffffffffffff67 = bVar4 ^ 0xff;
      }
      bVar5 = in_stack_ffffffffffffff67 & 1;
      if ((bVar5 != 0) && (bVar4 = HEkk::tabooBadBasisChange(in_stack_ffffffffffffff58), bVar4)) {
        in_RDI->solve_phase = 5;
        return;
      }
    } while (bVar5 == 0);
    HighsSimplexAnalysis::simplexTimerStop
              ((HighsSimplexAnalysis *)
               CONCAT17(in_stack_ffffffffffffff67,
                        CONCAT16(in_stack_ffffffffffffff66,
                                 CONCAT24(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))),
               (HighsInt)((ulong)in_stack_ffffffffffffff58 >> 0x20),
               (HighsInt)in_stack_ffffffffffffff58);
    if ((in_RDI->ekk_instance_->solve_bailout_ & 1U) == 0) {
      if (in_RDI->row_out == -1) {
        highsLogDev(&(in_RDI->ekk_instance_->options_->super_HighsOptionsStruct).log_options,
                    kDetailed,"dual-phase-1-optimal\n");
        dVar1 = (pHVar2->info_).dual_objective_value;
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          assessPhase1Optimality
                    ((HEkkDual *)
                     CONCAT17(in_stack_ffffffffffffff67,
                              CONCAT16(in_stack_ffffffffffffff66,
                                       CONCAT24(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                                      )));
        }
        else {
          in_RDI->solve_phase = 2;
        }
      }
      else if ((in_RDI->rebuild_reason == 9) || (in_RDI->rebuild_reason == 0xb)) {
        in_RDI->solve_phase = -3;
        if (in_RDI->rebuild_reason == 9) {
          highsLogUser(&(in_RDI->ekk_instance_->options_->super_HighsOptionsStruct).log_options,
                       kError,
                       "Dual simplex ratio test failed due to excessive dual values: consider scaling down the LP objective coefficients\n"
                      );
        }
        else {
          highsLogUser(&(in_RDI->ekk_instance_->options_->super_HighsOptionsStruct).log_options,
                       kError,
                       "Dual simplex detected excessive primal values: consider scaling down the LP bounds\n"
                      );
        }
        highsLogDev(&(in_RDI->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kInfo,
                    "dual-phase-1-not-solved\n");
        *pHVar7 = kSolveError;
      }
      else if (in_RDI->variable_in == -1) {
        ctx = (EVP_PKEY_CTX *)0x1;
        highsLogDev(&(in_RDI->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kInfo,
                    "dual-phase-1-unbounded\n");
        if (((in_RDI->ekk_instance_->info_).costs_perturbed & 1U) == 0) {
          in_RDI->solve_phase = -3;
          highsLogDev(&(in_RDI->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kInfo
                      ,"dual-phase-1-not-solved\n");
          *pHVar7 = kSolveError;
        }
        else {
          cleanup(in_RDI,ctx);
          highsLogDev(&(in_RDI->ekk_instance_->options_->super_HighsOptionsStruct).log_options,
                      kWarning,"Cleaning up cost perturbation when unbounded in phase 1\n");
          if (in_RDI->dualInfeasCount == 0) {
            in_RDI->solve_phase = 2;
          }
        }
      }
      bVar4 = false;
      if (0 < (in_RDI->ekk_instance_->info_).num_dual_infeasibilities) {
        bVar4 = *pHVar7 == kMin;
      }
      if (!bVar4) {
        paVar8 = &local_79;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_78,"End of solvePhase1",paVar8);
        HVar6 = debugDualSimplex(in_stack_ffffffffffffff98,(string *)in_stack_ffffffffffffff90,
                                 (bool)in_stack_ffffffffffffff8f);
        std::__cxx11::string::~string(local_78);
        std::allocator<char>::~allocator((allocator<char> *)&local_79);
        if (HVar6 == kLogicalError) {
          in_RDI->solve_phase = -3;
          return;
        }
      }
      bVar4 = true;
      if (((in_RDI->solve_phase != 1) && (bVar4 = true, in_RDI->solve_phase != 2)) &&
         (bVar4 = true, in_RDI->solve_phase != -2)) {
        bVar4 = in_RDI->solve_phase == -3;
      }
      if (!bVar4) {
        highsLogDev(&(in_RDI->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kInfo,
                    "HEkkDual::solvePhase1 solve_phase == %d (solve call %d; iter %d)\n",
                    (ulong)(uint)in_RDI->solve_phase,
                    (ulong)(uint)in_RDI->ekk_instance_->debug_solve_call_num_,
                    (ulong)(uint)in_RDI->ekk_instance_->iteration_count_);
      }
      if (((in_RDI->solve_phase == 2) || (in_RDI->solve_phase == -2)) || (in_RDI->solve_phase == -3)
         ) {
        HEkk::initialiseBound
                  (in_stack_00000030,in_stack_0000002c,in_stack_00000028,in_stack_00000027);
        HEkk::initialiseNonbasicValueAndMove(in_stack_ffffffffffffff90);
        if (in_RDI->solve_phase == 2) {
          if (in_RDI->ekk_instance_->dual_simplex_phase1_cleanup_level_ <
              (in_RDI->ekk_instance_->options_->super_HighsOptionsStruct).
              max_dual_simplex_phase1_cleanup_level) {
            (pHVar2->info_).allow_cost_shifting = true;
            (pHVar2->info_).allow_cost_perturbation = true;
          }
          if (((pHVar2->info_).allow_cost_perturbation & 1U) == 0) {
            highsLogDev(&(in_RDI->ekk_instance_->options_->super_HighsOptionsStruct).log_options,
                        kWarning,"Moving to phase 2, but not allowing cost perturbation\n");
          }
        }
      }
    }
  }
  return;
}

Assistant:

void HEkkDual::solvePhase1() {
  // Performs dual phase 1 iterations. Returns solve_phase with value
  //
  // kSolvePhaseError => Solver error
  //
  // kSolvePhaseTabooBasis => Only basis change is taboo
  //
  // kSolvePhaseExit => LP identified as dual infeasible
  //
  // kSolvePhaseUnknown => Back-tracking due to singularity
  //
  // kSolvePhase1 => Dual infeasibility suspected, but have to go out
  // and back in to solvePhase1 to perform fresh rebuild. Also if
  // bailing out due to reaching time/iteration limit.
  //
  // kSolvePhase2 => Continue with dual phase 2 iterations

  HighsSimplexInfo& info = ekk_instance_.info_;
  HighsSimplexStatus& status = ekk_instance_.status_;
  HighsModelStatus& model_status = ekk_instance_.model_status_;
  // When starting a new phase the (updated) dual objective function
  // value isn't known. Indicate this so that when the value computed
  // from scratch in build() isn't checked against the updated
  // value
  status.has_primal_objective_value = false;
  status.has_dual_objective_value = false;
  // Set rebuild_reason so that it's assigned when first tested
  rebuild_reason = kRebuildReasonNo;
  // Use to set solve_phase = kSolvePhase1 and ekk_instance_.solve_bailout_ =
  // false so they are set if solvePhase1() is called directly - but it never is
  assert(solve_phase == kSolvePhase1);
  assert(!ekk_instance_.solve_bailout_);
  if (ekk_instance_.bailout()) return;
  // Report the phase start
  highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kDetailed,
              "dual-phase-1-start\n");
  // Switch to dual phase 1 bounds
  ekk_instance_.initialiseBound(SimplexAlgorithm::kDual, solve_phase);
  ekk_instance_.initialiseNonbasicValueAndMove();

  // If there's no backtracking basis, save the initial basis in case of
  // backtracking
  if (!info.valid_backtracking_basis_) ekk_instance_.putBacktrackingBasis();

  // Main solving structure
  analysis->simplexTimerStart(IterateClock);
  for (;;) {
    analysis->simplexTimerStart(IterateDualRebuildClock);
    rebuild();
    analysis->simplexTimerStop(IterateDualRebuildClock);
    if (solve_phase == kSolvePhaseError) {
      model_status = HighsModelStatus::kSolveError;
      return;
    }
    if (solve_phase == kSolvePhaseUnknown) {
      // If backtracking, may change phase, so drop out
      analysis->simplexTimerStop(IterateClock);
      return;
    }
    if (ekk_instance_.bailout()) break;
    for (;;) {
      if (debugDualSimplex("Before iteration") ==
          HighsDebugStatus::kLogicalError) {
        solve_phase = kSolvePhaseError;
        return;
      }
      switch (info.simplex_strategy) {
        default:
        case kSimplexStrategyDualPlain:
          iterate();
          break;
        case kSimplexStrategyDualTasks:
          iterateTasks();
          break;
        case kSimplexStrategyDualMulti:
          iterateMulti();
          break;
      }
      if (ekk_instance_.bailout()) break;
      assert(solve_phase != kSolvePhaseTabooBasis);
      if (rebuild_reason) break;
    }
    if (ekk_instance_.solve_bailout_) break;
    // If the data are fresh from rebuild(), possibly break out of the
    // outer loop to see what's occurred
    //
    // Deciding whether to rebuild is now more complicated if
    // refactorization is being avoided, since
    // status.has_fresh_rebuild being true may not imply that there is
    // a fresh factorization
    //
    bool finished = status.has_fresh_rebuild &&
                    !ekk_instance_.rebuildRefactor(rebuild_reason);
    if (finished && ekk_instance_.tabooBadBasisChange()) {
      // A bad basis change has had to be made taboo without any other
      // basis changes having been performed from a fresh rebuild. In
      // other words, the only basis change that could be made is not
      // permitted, so no definitive statement about the LP can be
      // made.
      solve_phase = kSolvePhaseTabooBasis;
      return;
    }
    if (finished) break;
  }
  analysis->simplexTimerStop(IterateClock);
  // Possibly return due to bailing out, having now stopped
  // IterateClock
  if (ekk_instance_.solve_bailout_) return;

  // If bailing out, should have done so already
  assert(!ekk_instance_.solve_bailout_);
  // Assess outcome of dual phase 1
  if (row_out == kNoRowChosen) {
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kDetailed,
                "dual-phase-1-optimal\n");
    // Optimal in phase 1
    if (info.dual_objective_value == 0) {
      // Zero phase 1 objective so go to phase 2
      //
      // This is the usual way to exit phase 1. Although the test
      // looks ambitious, the dual objective is the sum of products of
      // primal and dual values for nonbasic variables. For dual
      // simplex phase 1, the primal bounds are set so that when the
      // dual value is feasible, the primal value is set to
      // zero. Otherwise the value is +1/-1 according to the required
      // sign of the dual, except for free variables, where the bounds
      // are [-1000, 1000].
      //
      // OK if costs are perturbed, since they remain perturbed in phase 2 until
      // the final clean-up
      solve_phase = kSolvePhase2;
    } else {
      // A nonzero dual objective value at an optimal solution of
      // phase 1 means that there may be dual infeasibilities. If the
      // objective value is very negative, then it's clear
      // enough. However, if it's small in magnitude, it could be the
      // sum of values, all of which are smaller than the dual
      // feasibility tolerance. Plus there may be cost perturbations
      // to remove before reliable conclusions on dual infeasibility
      // of the (scaled) LP being solved can be drawn.
      //
      // If assessPhase1Optimality() is happy that there are no dual
      // infeasibilities, it will set solve_phase = kSolvePhase2;
      assessPhase1Optimality();
    }
  } else if (rebuild_reason == kRebuildReasonChooseColumnFail ||
             rebuild_reason == kRebuildReasonExcessivePrimalValue) {
    // chooseColumn has failed or excessive primal values have been
    // created Behave as "Report strange issues" below
    solve_phase = kSolvePhaseError;
    // Solve error is opaque to users, so put in some logging
    if (rebuild_reason == kRebuildReasonChooseColumnFail) {
      highsLogUser(
          ekk_instance_.options_->log_options, HighsLogType::kError,
          "Dual simplex ratio test failed due to excessive dual values: "
          "consider scaling down the LP objective coefficients\n");
    } else {
      highsLogUser(ekk_instance_.options_->log_options, HighsLogType::kError,
                   "Dual simplex detected excessive primal values: consider "
                   "scaling down the LP bounds\n");
    }
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                "dual-phase-1-not-solved\n");
    model_status = HighsModelStatus::kSolveError;
  } else if (variable_in == -1) {
    // We got dual phase 1 unbounded - strange
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                "dual-phase-1-unbounded\n");
    // This use of costs_alt_perturbed is (unsurprisingly) not
    // executed by ctest
    //
    // assert(99==1);
    if (ekk_instance_.info_.costs_perturbed) {
      // Clean up perturbation
      cleanup();
      highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kWarning,
                  "Cleaning up cost perturbation when unbounded in phase 1\n");
      if (dualInfeasCount == 0) {
        // No dual infeasibilities and (since unbounded) at least zero
        // phase 1 objective so go to phase 2
        solve_phase = kSolvePhase2;
      }
    } else {
      // Report strange issues
      solve_phase = kSolvePhaseError;
      highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                  "dual-phase-1-not-solved\n");
      model_status = HighsModelStatus::kSolveError;
    }
  }

  // Debug here since not all simplex data will be correct until after
  // rebuild() when switching to Phase 2
  //
  // Also have to avoid debug when the model status is not set and
  // there are dual infeasibilities, since this happens legitimately
  // when the LP is dual infeasible. However, the model status can't
  // be set to dual infeasible until perturbations have been removed.
  //
  const bool no_debug = ekk_instance_.info_.num_dual_infeasibilities > 0 &&
                        model_status == HighsModelStatus::kNotset;
  if (!no_debug) {
    if (debugDualSimplex("End of solvePhase1") ==
        HighsDebugStatus::kLogicalError) {
      solve_phase = kSolvePhaseError;
      return;
    }
  }

  // Can also get here with solve_phase = kSolvePhaseError
  const bool solve_phase_ok =
      solve_phase == kSolvePhase1 || solve_phase == kSolvePhase2 ||
      solve_phase == kSolvePhaseExit || solve_phase == kSolvePhaseError;
  if (!solve_phase_ok)
    highsLogDev(
        ekk_instance_.options_->log_options, HighsLogType::kInfo,
        "HEkkDual::solvePhase1 solve_phase == %d (solve call %d; iter %d)\n",
        (int)solve_phase, (int)ekk_instance_.debug_solve_call_num_,
        (int)ekk_instance_.iteration_count_);
  assert(solve_phase_ok);
  if (solve_phase == kSolvePhase2 || solve_phase == kSolvePhaseExit ||
      solve_phase == kSolvePhaseError) {
    // Moving to phase 2 or exiting, so make sure that the simplex
    // bounds and nonbasic value/move correspond to the LP
    ekk_instance_.initialiseBound(SimplexAlgorithm::kDual, kSolvePhase2);
    ekk_instance_.initialiseNonbasicValueAndMove();
    if (solve_phase == kSolvePhase2) {
      // Moving to phase 2 so possibly reinstate cost perturbation
      if (ekk_instance_.dual_simplex_phase1_cleanup_level_ <
          ekk_instance_.options_->max_dual_simplex_phase1_cleanup_level) {
        // Allow cost perturbation for now, but may have to prevent it
        // to avoid cleanup-perturbation loops
        info.allow_cost_shifting = true;
        info.allow_cost_perturbation = true;
      }
      // Comment if cost perturbation is not permitted
      if (!info.allow_cost_perturbation)
        highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kWarning,
                    "Moving to phase 2, but not allowing cost perturbation\n");
    }
  }
  return;
}